

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::DoubleAPFloat::makeLargest(DoubleAPFloat *this,bool Neg)

{
  type pAVar1;
  APInt local_78;
  APFloat local_68;
  APInt local_48;
  APFloat local_38;
  byte local_11;
  DoubleAPFloat *pDStack_10;
  bool Neg_local;
  DoubleAPFloat *this_local;
  
  local_11 = Neg;
  pDStack_10 = this;
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x1084,"void llvm::detail::DoubleAPFloat::makeLargest(bool)");
  }
  APInt::APInt(&local_48,0x40,0x7fefffffffffffff,false);
  APFloat::APFloat(&local_38,(fltSemantics *)semIEEEdouble,&local_48);
  pAVar1 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                     (&this->Floats,0);
  APFloat::operator=(pAVar1,&local_38);
  APFloat::~APFloat(&local_38);
  APInt::~APInt(&local_48);
  APInt::APInt(&local_78,0x40,0x7c8ffffffffffffe,false);
  APFloat::APFloat(&local_68,(fltSemantics *)semIEEEdouble,&local_78);
  pAVar1 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                     (&this->Floats,1);
  APFloat::operator=(pAVar1,&local_68);
  APFloat::~APFloat(&local_68);
  APInt::~APInt(&local_78);
  if ((local_11 & 1) != 0) {
    changeSign(this);
  }
  return;
}

Assistant:

void DoubleAPFloat::makeLargest(bool Neg) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  Floats[0] = APFloat(semIEEEdouble, APInt(64, 0x7fefffffffffffffull));
  Floats[1] = APFloat(semIEEEdouble, APInt(64, 0x7c8ffffffffffffeull));
  if (Neg)
    changeSign();
}